

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall
amrex::FabArrayBase::CPC::define
          (CPC *this,BoxArray *ba_dst,DistributionMapping *dm_dst,
          Vector<int,_std::allocator<int>_> *imap_dst,BoxArray *ba_src,DistributionMapping *dm_src,
          Vector<int,_std::allocator<int>_> *imap_src,int MyProc)

{
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer *ppCVar2;
  undefined8 uVar3;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *__ptr;
  pointer piVar4;
  pointer piVar5;
  iterator iVar6;
  _Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  this_01;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  int *piVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  void *pvVar14;
  Box *pBVar15;
  pointer ppVar16;
  undefined4 uVar17;
  IntVect *pIVar18;
  pointer pBVar19;
  int iVar20;
  pointer __p;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar21
  ;
  pointer pmVar22;
  mapped_type *pmVar23;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *puVar24;
  _Rb_tree_node_base *p_Var25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  pointer pIVar29;
  int iVar30;
  IndexType IVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  pointer bx;
  uint uVar35;
  Box *b;
  Box *pBVar36;
  pointer pBVar37;
  bool bVar38;
  Box r;
  int src_owner;
  BoxList bl_local;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r_2;
  BoxList bl_remote;
  BoxList bl_dst_1;
  BoxList tilelist;
  undefined1 local_228 [112];
  pointer local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  int local_19c;
  BoxList local_198;
  undefined1 local_178 [16];
  pointer local_168;
  IntVect *local_160;
  ulong local_158;
  ulong local_150;
  IntVect *local_148;
  ulong local_140;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_138;
  long local_130;
  Box *local_128;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_120;
  Vector<int,_std::allocator<int>_> *local_108;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_100;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_f8;
  BoxArray *local_f0;
  DistributionMapping *local_e8;
  DistributionMapping *local_e0;
  Box local_d8;
  Box local_bc;
  BoxList local_a0;
  ulong local_80;
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  *local_78;
  BoxList local_70;
  BoxList local_50;
  
  local_108 = imap_dst;
  local_f0 = ba_src;
  local_e8 = dm_src;
  local_e0 = dm_dst;
  pvVar21 = (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)operator_new(0x18);
  *(undefined1 (*) [16])
   &(pvVar21->
    super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
    )._M_impl = (undefined1  [16])0x0;
  *(pointer *)
   ((long)&(pvVar21->
           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
           )._M_impl + 0x10) = (pointer)0x0;
  this_00 = &(this->super_CommMetaData).m_LocTags;
  local_228._0_8_ =
       (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
        *)0x0;
  __ptr = (this->super_CommMetaData).m_LocTags._M_t.
          super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
          .
          super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
          ._M_head_impl;
  (this->super_CommMetaData).m_LocTags._M_t.
  super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  .
  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
  ._M_head_impl = pvVar21;
  if (__ptr != (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                *)0x0) {
    std::
    default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
    ::operator()((default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
                  *)this_00,__ptr);
  }
  if ((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
       *)local_228._0_8_ !=
      (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
       *)0x0) {
    std::
    default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
    ::operator()((default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
                  *)local_228,
                 (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  *)local_228._0_8_);
  }
  pmVar22 = (pointer)operator_new(0x30);
  p_Var1 = &(pmVar22->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(pmVar22->_M_t)._M_impl = (undefined1  [16])0x0;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = &(this->super_CommMetaData).m_SndTags;
  local_228._0_8_ =
       (__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_100,pmVar22);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)local_228);
  pmVar22 = (pointer)operator_new(0x30);
  p_Var1 = &(pmVar22->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(pmVar22->_M_t)._M_impl = (undefined1  [16])0x0;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pmVar22->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = &(this->super_CommMetaData).m_RcvTags;
  local_228._0_8_ =
       (__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_f8,pmVar22);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)local_228);
  local_160 = (IntVect *)
              (local_108->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_1b8 = (local_108->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  if ((local_160 != (IntVect *)local_1b8) ||
     ((imap_src->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (imap_src->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)) {
    piVar4 = (imap_src->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    piVar5 = (imap_src->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_178 = (undefined1  [16])0x0;
    local_168 = (pointer)0x0;
    local_78 = this_00;
    Periodicity::shiftIntVect(&local_120,&this->m_period);
    uVar35 = (uint)((ulong)((long)piVar4 - (long)piVar5) >> 2);
    if (0 < (int)uVar35) {
      local_148 = &this->m_dstng;
      local_128 = (Box *)(local_100->_M_t).
                         super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                         .
                         super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                         ._M_head_impl;
      local_158 = (ulong)(uVar35 & 0x7fffffff);
      uVar28 = 0;
      do {
        iVar34 = (imap_src->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar28];
        local_130 = (long)iVar34;
        local_150 = uVar28;
        BATransformer::operator()
                  ((Box *)local_228,&local_f0->m_bat,
                   (Box *)(local_130 * 0x1c +
                          *(long *)&(((local_f0->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar17 = local_228._24_4_;
          iVar30 = (this->m_srcng).vect[0];
          iVar33 = (this->m_srcng).vect[1];
          local_138 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                       *)CONCAT44(local_138._4_4_,local_228._0_4_ - iVar30);
          local_140 = CONCAT44(local_140._4_4_,local_228._4_4_ - iVar33);
          iVar20 = (this->m_srcng).vect[2];
          local_1b0 = CONCAT44(local_1b0._4_4_,local_228._8_4_ - iVar20);
          iVar30 = iVar30 + local_228._12_4_;
          iVar33 = iVar33 + local_228._16_4_;
          iVar20 = iVar20 + local_228._20_4_;
          pIVar29 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            local_228._4_4_ = pIVar29->vect[1] + (int)local_140;
            local_228._0_4_ = pIVar29->vect[0] + (int)local_138;
            local_228._8_4_ = pIVar29->vect[2] + (int)local_1b0;
            local_228._12_4_ = pIVar29->vect[0] + iVar30;
            local_228._16_4_ = pIVar29->vect[1] + iVar33;
            local_228._20_4_ = pIVar29->vect[2] + iVar20;
            local_228._20_8_ = CONCAT44(uVar17,local_228._20_4_);
            BoxArray::intersections
                      (ba_dst,(Box *)local_228,
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)local_178,false,local_148);
            local_1a8 = (ulong)(local_178._8_8_ - local_178._0_8_) >> 5;
            if (0 < (int)(uint)local_1a8) {
              local_1a8 = (ulong)((uint)local_1a8 & 0x7fffffff);
              uVar28 = 0;
              do {
                iVar27 = ((pointer)(local_178._0_8_ + uVar28 * 0x20))->first;
                local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     *(int *)(*(long *)&(((local_e0->m_ref).
                                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                             (long)iVar27 * 4);
                if ((int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start < 0) {
                  iVar26 = 0;
                }
                else {
                  iVar26 = (int)local_a0.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start -
                           (int)local_a0.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start %
                           (int)ParallelDescriptor::m_Team._4_4_;
                }
                if ((ParallelDescriptor::m_Team._12_4_ != iVar26) &&
                   (*(int *)(*(long *)&(((local_e8->m_ref).
                                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
                            local_130 * 4) == MyProc)) {
                  ppVar16 = (pointer)(local_178._0_8_ + uVar28 * 0x20);
                  if (this->m_tgco == true) {
                    BATransformer::operator()
                              ((Box *)local_228,&ba_dst->m_bat,
                               (Box *)((long)iVar27 * 0x1c +
                                      *(long *)&(((ba_dst->m_ref).
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->m_abox).
                                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                .
                                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                ._M_impl.super__Vector_impl_data));
                    boxDiff(&local_198,&ppVar16->second,(Box *)local_228);
                    pBVar36 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pBVar15 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  else {
                    BoxList::BoxList(&local_198,&ppVar16->second);
                    pBVar36 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pBVar15 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  for (; pBVar36 != pBVar15; pBVar36 = pBVar36 + 1) {
                    pmVar23 = std::
                              map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                              ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                            *)local_128,(key_type *)&local_a0);
                    local_228._52_4_ = (pBVar36->btype).itype;
                    uVar3 = *(undefined8 *)((pBVar36->bigend).vect + 1);
                    local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar29->vect + 1);
                    local_228._44_4_ = (int)uVar3 - local_228._32_4_;
                    local_228._36_4_ =
                         (undefined4)((ulong)*(undefined8 *)(pIVar29->vect + 1) >> 0x20);
                    local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) - local_228._36_4_;
                    local_228._28_4_ = (pBVar36->smallend).vect[0] - pIVar29->vect[0];
                    local_228._32_4_ = (pBVar36->smallend).vect[1] - local_228._32_4_;
                    local_228._36_4_ = (pBVar36->smallend).vect[2] - local_228._36_4_;
                    local_228._40_4_ = (pBVar36->bigend).vect[0] - pIVar29->vect[0];
                    local_228._0_8_ = *(undefined8 *)(pBVar36->smallend).vect;
                    piVar11 = (pBVar36->smallend).vect + 2;
                    local_228._8_4_ = *piVar11;
                    local_228._12_4_ = (pBVar36->bigend).vect[0];
                    uVar3 = *(undefined8 *)piVar11;
                    local_228._20_8_ = *(undefined8 *)((pBVar36->bigend).vect + 2);
                    local_228._16_4_ =
                         (undefined4)((ulong)*(undefined8 *)(pBVar36->bigend).vect >> 0x20);
                    iVar6._M_current =
                         (pmVar23->
                         super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    local_228._56_4_ = iVar27;
                    local_228._60_4_ = iVar34;
                    if (iVar6._M_current ==
                        (pmVar23->
                        super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                      ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                (pmVar23,iVar6,(CopyComTag *)local_228);
                    }
                    else {
                      *(ulong *)(((iVar6._M_current)->sbox).bigend.vect + 2) =
                           CONCAT44(local_228._52_4_,local_228._48_4_);
                      (iVar6._M_current)->dstIndex = iVar27;
                      (iVar6._M_current)->srcIndex = iVar34;
                      *(ulong *)(((iVar6._M_current)->sbox).smallend.vect + 1) =
                           CONCAT44(local_228._36_4_,local_228._32_4_);
                      *(ulong *)((iVar6._M_current)->sbox).bigend.vect =
                           CONCAT44(local_228._44_4_,local_228._40_4_);
                      ((iVar6._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                      ((iVar6._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                      ((iVar6._M_current)->dbox).btype.itype = local_228._24_4_;
                      ((iVar6._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                      *(undefined8 *)((iVar6._M_current)->dbox).smallend.vect = local_228._0_8_;
                      *(undefined8 *)(((iVar6._M_current)->dbox).smallend.vect + 2) = uVar3;
                      ppCVar2 = &(pmVar23->
                                 super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      *ppCVar2 = *ppCVar2 + 1;
                    }
                  }
                  if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start != (Box *)0x0) {
                    operator_delete(local_198.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_198.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_198.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != local_1a8);
            }
            pIVar29 = pIVar29 + 1;
          } while (pIVar29 !=
                   local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        uVar28 = local_150 + 1;
      } while (uVar28 != local_158);
    }
    IVar31.itype = 0;
    switch((ba_dst->m_bat).m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      IVar31.itype = (ba_dst->m_bat).m_op.m_indexType.m_typ.itype;
      break;
    default:
      IVar31.itype = (ba_dst->m_bat).m_op.m_bndryReg.m_typ.itype;
    }
    local_138 = (local_f8->_M_t).
                super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                .
                super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                ._M_head_impl;
    BoxList::BoxList(&local_198,IVar31);
    pIVar18 = local_160;
    IVar31.itype = 0;
    switch((ba_dst->m_bat).m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      IVar31.itype = (ba_dst->m_bat).m_op.m_indexType.m_typ.itype;
      break;
    default:
      IVar31.itype = (ba_dst->m_bat).m_op.m_bndryReg.m_typ.itype;
    }
    BoxList::BoxList(&local_a0,IVar31);
    local_1b8 = (pointer)((ulong)((long)local_1b8 - (long)pIVar18) >> 2);
    if (0 < (int)(uint)local_1b8) {
      local_160 = &this->m_srcng;
      local_130 = CONCAT44(local_130._4_4_,ParallelDescriptor::m_Team._4_4_);
      local_1b8 = (pointer)(ulong)((uint)local_1b8 & 0x7fffffff);
      uVar28 = 0;
      do {
        iVar34 = (local_108->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar28];
        local_1a8 = (ulong)iVar34;
        local_80 = uVar28;
        BATransformer::operator()
                  (&local_bc,&ba_dst->m_bat,
                   (Box *)(local_1a8 * 0x1c +
                          *(long *)&(((ba_dst->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        IVar31.itype = local_bc.btype.itype;
        if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar30 = (this->m_dstng).vect[0];
          iVar33 = (this->m_dstng).vect[1];
          iVar27 = local_bc.smallend.vect[0] - iVar30;
          iVar26 = local_bc.smallend.vect[1] - iVar33;
          iVar20 = (this->m_dstng).vect[2];
          iVar32 = local_bc.smallend.vect[2] - iVar20;
          local_148 = (IntVect *)CONCAT44(local_148._4_4_,iVar30 + local_bc.bigend.vect[0]);
          local_150 = CONCAT44(local_150._4_4_,iVar33 + local_bc.bigend.vect[1]);
          local_158 = CONCAT44(local_158._4_4_,iVar20 + local_bc.bigend.vect[2]);
          pIVar29 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            local_228._4_4_ = pIVar29->vect[1] + iVar26;
            local_228._0_4_ = pIVar29->vect[0] + iVar27;
            local_228._8_4_ = pIVar29->vect[2] + iVar32;
            local_228._12_4_ = pIVar29->vect[0] + (int)local_148;
            local_228._16_4_ = pIVar29->vect[1] + (int)local_150;
            local_228._24_4_ = IVar31.itype;
            local_228._20_4_ = pIVar29->vect[2] + (int)local_158;
            BoxArray::intersections
                      (local_f0,(Box *)local_228,
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)local_178,false,local_160);
            local_1b0 = (ulong)(local_178._8_8_ - local_178._0_8_) >> 5;
            if (0 < (int)(uint)local_1b0) {
              local_1b0 = (ulong)((uint)local_1b0 & 0x7fffffff);
              uVar28 = 0;
              do {
                iVar30 = ((pointer)(local_178._0_8_ + uVar28 * 0x20))->first;
                uVar3 = *(undefined8 *)
                         (((pointer)(local_178._0_8_ + uVar28 * 0x20))->second).smallend.vect;
                uVar12 = *(undefined8 *)
                          ((((pointer)(local_178._0_8_ + uVar28 * 0x20))->second).smallend.vect + 2)
                ;
                uVar13 = *(undefined8 *)
                          ((((pointer)(local_178._0_8_ + uVar28 * 0x20))->second).bigend.vect + 2);
                local_d8.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)
                                   (((pointer)(local_178._0_8_ + uVar28 * 0x20))->second).bigend.
                                   vect >> 0x20);
                local_d8.smallend.vect[2] = (int)uVar12;
                local_d8.bigend.vect[0] = (int)((ulong)uVar12 >> 0x20);
                local_d8.smallend.vect[1] =
                     (int)((ulong)uVar3 >> 0x20) -
                     (int)((ulong)*(undefined8 *)pIVar29->vect >> 0x20);
                local_d8.smallend.vect[0] = (int)uVar3 - (int)*(undefined8 *)pIVar29->vect;
                local_d8.smallend.vect[2] = local_d8.smallend.vect[2] - pIVar29->vect[2];
                local_d8.bigend.vect[0] = local_d8.bigend.vect[0] - pIVar29->vect[0];
                local_d8.bigend.vect[1] = local_d8.bigend.vect[1] - pIVar29->vect[1];
                local_d8.bigend.vect[2] = (int)uVar13;
                local_d8.btype.itype = (uint)((ulong)uVar13 >> 0x20);
                local_d8.bigend.vect[2] = local_d8.bigend.vect[2] - pIVar29->vect[2];
                local_19c = *(int *)(*(long *)&(((local_e8->m_ref).
                                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_pmap).
                                               super_vector<int,_std::allocator<int>_>.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    + (long)iVar30 * 4);
                if (this->m_tgco == true) {
                  boxDiff(&local_70,&local_d8,&local_bc);
                }
                else {
                  BoxList::BoxList(&local_70,&local_d8);
                }
                local_128 = local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                bx = local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_140 = uVar28;
                if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  do {
                    iVar20 = 0;
                    iVar33 = 0;
                    if (-1 < local_19c) {
                      iVar33 = local_19c - local_19c % (int)ParallelDescriptor::m_Team._4_4_;
                    }
                    if (-1 < MyProc) {
                      iVar20 = MyProc - MyProc % (int)ParallelDescriptor::m_Team._4_4_;
                    }
                    if (iVar33 == iVar20) {
                      BoxList::BoxList(&local_50,bx,(IntVect *)&comm_tile_size);
                      pBVar19 = local_50.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      for (pBVar37 = local_50.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start; pBVar37 != pBVar19;
                          pBVar37 = pBVar37 + 1) {
                        this_01.
                        super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                        ._M_head_impl =
                             (local_78->_M_t).
                             super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                        ;
                        local_228._52_4_ = (pBVar37->btype).itype;
                        uVar3 = *(undefined8 *)((pBVar37->bigend).vect + 1);
                        local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar29->vect + 1);
                        local_228._44_4_ = (int)uVar3 + local_228._32_4_;
                        local_228._36_4_ =
                             (undefined4)((ulong)*(undefined8 *)(pIVar29->vect + 1) >> 0x20);
                        local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) + local_228._36_4_;
                        local_228._28_4_ = pIVar29->vect[0] + (pBVar37->smallend).vect[0];
                        local_228._32_4_ = local_228._32_4_ + (pBVar37->smallend).vect[1];
                        local_228._36_4_ = local_228._36_4_ + (pBVar37->smallend).vect[2];
                        local_228._40_4_ = pIVar29->vect[0] + (pBVar37->bigend).vect[0];
                        local_228._0_8_ = *(undefined8 *)(pBVar37->smallend).vect;
                        uVar3 = *(undefined8 *)((pBVar37->smallend).vect + 2);
                        local_228._20_8_ = *(undefined8 *)((pBVar37->bigend).vect + 2);
                        local_228._16_4_ =
                             (undefined4)((ulong)*(undefined8 *)(pBVar37->bigend).vect >> 0x20);
                        local_228._8_4_ = (undefined4)uVar3;
                        local_228._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                        iVar6._M_current =
                             *(pointer *)
                              ((long)this_01.
                                     super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                     ._M_head_impl + 8);
                        if (iVar6._M_current ==
                            *(pointer *)
                             ((long)this_01.
                                    super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                    ._M_head_impl + 0x10)) {
                          local_228._56_4_ = iVar34;
                          local_228._60_4_ = iVar30;
                          std::
                          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                          ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                    ((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                      *)this_01.
                                        super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                        ._M_head_impl,iVar6,(CopyComTag *)local_228);
                        }
                        else {
                          *(ulong *)(((iVar6._M_current)->sbox).bigend.vect + 2) =
                               CONCAT44(local_228._52_4_,local_228._48_4_);
                          (iVar6._M_current)->dstIndex = iVar34;
                          (iVar6._M_current)->srcIndex = iVar30;
                          *(ulong *)(((iVar6._M_current)->sbox).smallend.vect + 1) =
                               CONCAT44(local_228._36_4_,local_228._32_4_);
                          *(ulong *)((iVar6._M_current)->sbox).bigend.vect =
                               CONCAT44(local_228._44_4_,local_228._40_4_);
                          ((iVar6._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                          ((iVar6._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                          ((iVar6._M_current)->dbox).btype.itype = local_228._24_4_;
                          ((iVar6._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                          *(undefined8 *)((iVar6._M_current)->dbox).smallend.vect = local_228._0_8_;
                          *(undefined8 *)(((iVar6._M_current)->dbox).smallend.vect + 2) = uVar3;
                          *(pointer *)
                           ((long)this_01.
                                  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                  ._M_head_impl + 8) =
                               *(pointer *)
                                ((long)this_01.
                                       super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                       ._M_head_impl + 8) + 1;
                          local_228._56_4_ = iVar34;
                          local_228._60_4_ = iVar30;
                        }
                      }
                      if (1 < (int)local_130) {
                        if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<amrex::Box,std::allocator<amrex::Box>>::
                          _M_realloc_insert<amrex::Box_const&>
                                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_198,
                                     (iterator)
                                     local_198.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,bx);
                        }
                        else {
                          uVar3 = *(undefined8 *)(bx->smallend).vect;
                          uVar12 = *(undefined8 *)((bx->smallend).vect + 2);
                          iVar33 = (bx->bigend).vect[1];
                          iVar20 = (bx->bigend).vect[2];
                          uVar35 = (bx->btype).itype;
                          ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish)->bigend).vect[0] =
                               (bx->bigend).vect[0];
                          ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish)->bigend).vect[1] = iVar33;
                          ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish)->bigend).vect[2] = iVar20;
                          ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish)->btype).itype = uVar35;
                          *(undefined8 *)
                           ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish)->smallend).vect = uVar3;
                          *(undefined8 *)
                           (((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar12;
                          local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_198.m_lbox.
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                      }
                      if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_50.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_50.m_lbox.
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_50.m_lbox.
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    else if (*(int *)(*(long *)&(((local_e0->m_ref).
                                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->m_pmap).
                                                super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + local_1a8 * 4) == MyProc) {
                      pmVar23 = std::
                                map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                ::operator[](local_138,&local_19c);
                      local_228._52_4_ = (bx->btype).itype;
                      uVar3 = *(undefined8 *)((bx->bigend).vect + 1);
                      local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar29->vect + 1);
                      local_228._44_4_ = (int)uVar3 + local_228._32_4_;
                      local_228._36_4_ =
                           (undefined4)((ulong)*(undefined8 *)(pIVar29->vect + 1) >> 0x20);
                      local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) + local_228._36_4_;
                      local_228._28_4_ = pIVar29->vect[0] + (bx->smallend).vect[0];
                      local_228._32_4_ = local_228._32_4_ + (bx->smallend).vect[1];
                      local_228._36_4_ = local_228._36_4_ + (bx->smallend).vect[2];
                      local_228._40_4_ = pIVar29->vect[0] + (bx->bigend).vect[0];
                      local_228._0_8_ = *(undefined8 *)(bx->smallend).vect;
                      uVar3 = *(undefined8 *)((bx->smallend).vect + 2);
                      local_228._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
                      local_228._16_4_ =
                           (undefined4)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
                      local_228._8_4_ = (undefined4)uVar3;
                      local_228._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      iVar6._M_current =
                           (pmVar23->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar6._M_current ==
                          (pmVar23->
                          super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        local_228._56_4_ = iVar34;
                        local_228._60_4_ = iVar30;
                        std::
                        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                  (pmVar23,iVar6,(CopyComTag *)local_228);
                      }
                      else {
                        *(ulong *)(((iVar6._M_current)->sbox).bigend.vect + 2) =
                             CONCAT44(local_228._52_4_,local_228._48_4_);
                        (iVar6._M_current)->dstIndex = iVar34;
                        (iVar6._M_current)->srcIndex = iVar30;
                        *(ulong *)(((iVar6._M_current)->sbox).smallend.vect + 1) =
                             CONCAT44(local_228._36_4_,local_228._32_4_);
                        *(ulong *)((iVar6._M_current)->sbox).bigend.vect =
                             CONCAT44(local_228._44_4_,local_228._40_4_);
                        ((iVar6._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                        ((iVar6._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                        ((iVar6._M_current)->dbox).btype.itype = local_228._24_4_;
                        ((iVar6._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                        *(undefined8 *)((iVar6._M_current)->dbox).smallend.vect = local_228._0_8_;
                        *(undefined8 *)(((iVar6._M_current)->dbox).smallend.vect + 2) = uVar3;
                        ppCVar2 = &(pmVar23->
                                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                        *ppCVar2 = *ppCVar2 + 1;
                        local_228._56_4_ = iVar34;
                        local_228._60_4_ = iVar30;
                      }
                    }
                    bx = bx + 1;
                  } while (bx != local_128);
                }
                if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start != (Box *)0x0) {
                  operator_delete(local_70.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_70.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_70.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                uVar28 = local_140 + 1;
              } while (uVar28 != local_1b0);
            }
            pIVar29 = pIVar29 + 1;
          } while (pIVar29 !=
                   local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        uVar28 = local_80 + 1;
      } while ((pointer)uVar28 != local_1b8);
    }
    if ((long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start < 0x38) {
      (this->super_CommMetaData).m_threadsafe_loc = true;
    }
    else {
      BoxArray::BoxArray((BoxArray *)local_228,&local_198);
      bVar38 = BoxArray::isDisjoint((BoxArray *)local_228);
      (this->super_CommMetaData).m_threadsafe_loc = bVar38;
      BoxArray::~BoxArray((BoxArray *)local_228);
    }
    if ((long)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish -
        CONCAT44(local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 (int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start) < 0x38) {
      (this->super_CommMetaData).m_threadsafe_rcv = true;
    }
    else {
      BoxArray::BoxArray((BoxArray *)local_228,&local_a0);
      bVar38 = BoxArray::isDisjoint((BoxArray *)local_228);
      (this->super_CommMetaData).m_threadsafe_rcv = bVar38;
      BoxArray::~BoxArray((BoxArray *)local_228);
    }
    iVar34 = 0;
    do {
      puVar24 = local_f8;
      if (iVar34 == 0) {
        puVar24 = local_100;
      }
      pmVar7 = (puVar24->_M_t).
               super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
               ._M_head_impl;
      for (p_Var25 = *(_Base_ptr *)((long)&(pmVar7->_M_t)._M_impl + 0x18);
          p_Var25 != (_Rb_tree_node_base *)((long)&(pmVar7->_M_t)._M_impl + 8U);
          p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25)) {
        p_Var8 = p_Var25[1]._M_parent;
        p_Var9 = p_Var25[1]._M_left;
        if (p_Var8 != p_Var9) {
          uVar28 = (long)p_Var9 - (long)p_Var8 >> 6;
          lVar10 = 0x3f;
          if (uVar28 != 0) {
            for (; uVar28 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var8,p_Var9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var8,p_Var9);
        }
      }
      bVar38 = iVar34 == 0;
      iVar34 = iVar34 + 1;
    } while (bVar38);
    pvVar14 = (void *)CONCAT44(local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                               .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (int)local_a0.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar14 != (void *)0x0) {
      operator_delete(pvVar14,(long)local_a0.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar14);
    }
    if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (Box *)0x0) {
      operator_delete(local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_,(long)local_168 - local_178._0_8_);
    }
  }
  return;
}

Assistant:

void
FabArrayBase::CPC::define (const BoxArray& ba_dst, const DistributionMapping& dm_dst,
                           const Vector<int>& imap_dst,
                           const BoxArray& ba_src, const DistributionMapping& dm_src,
                           const Vector<int>& imap_src,
                           int MyProc)
{
    BL_PROFILE("FabArrayBase::CPC::define()");

    BL_ASSERT(ba_dst.size() > 0 && ba_src.size() > 0);
    BL_ASSERT(ba_dst.ixType() == ba_src.ixType());

    m_LocTags = std::make_unique<CopyComTag::CopyComTagsContainer>();
    m_SndTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();
    m_RcvTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();

    if (!(imap_dst.empty() && imap_src.empty()))
    {
        const int nlocal_src = imap_src.size();
        const IntVect& ng_src = m_srcng;
        const int nlocal_dst = imap_dst.size();
        const IntVect& ng_dst = m_dstng;

        std::vector< std::pair<int,Box> > isects;

        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

        auto& send_tags = *m_SndTags;

        for (int i = 0; i < nlocal_src; ++i)
        {
            const int   k_src = imap_src[i];
            const Box& bx_src = amrex::grow(ba_src[k_src], ng_src);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_dst.intersections(bx_src+(*pit), isects, false, ng_dst);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_dst     = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm_dst[k_dst];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue; // local copy will be dealt with later
                    } else if (MyProc == dm_src[k_src]) {
                        BoxList const bl_dst = m_tgco ? boxDiff(bx, ba_dst[k_dst]) : BoxList(bx);
                        for (auto const& b : bl_dst) {
                            send_tags[dst_owner].push_back(CopyComTag(b, b-(*pit), k_dst, k_src));
                        }
                    }
                }
            }
        }

        auto& recv_tags = *m_RcvTags;

        BoxList bl_local(ba_dst.ixType());
        BoxList bl_remote(ba_dst.ixType());

        bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
        check_local = true;
        check_remote = true;
#elif defined(AMREX_USE_OMP)
        if (omp_get_max_threads() > 1) {
            check_local = true;
            check_remote = true;
        }
#endif

        if (ParallelDescriptor::TeamSize() > 1) {
            check_local = true;
        }

        for (int i = 0; i < nlocal_dst; ++i)
        {
            const int   k_dst = imap_dst[i];
            const Box& bx_dst_valid = ba_dst[k_dst];
            const Box& bx_dst = amrex::grow(bx_dst_valid, ng_dst);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_src.intersections(bx_dst+(*pit), isects, false, ng_src);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_src     = isects[j].first;
                    const Box& bx       = isects[j].second - *pit;
                    const int src_owner = dm_src[k_src];

                    BoxList const bl_dst = m_tgco ? boxDiff(bx,bx_dst_valid) : BoxList(bx);
                    for (auto const& b : bl_dst) {
                        if (ParallelDescriptor::sameTeam(src_owner, MyProc)) { // local copy
                            const BoxList tilelist(b, FabArrayBase::comm_tile_size);
                            for (auto const& btile : tilelist) {
                                m_LocTags->push_back(CopyComTag(btile, btile+(*pit), k_dst, k_src));
                            }
                            if (check_local) {
                                bl_local.push_back(b);
                            }
                        } else if (MyProc == dm_dst[k_dst]) {
                            recv_tags[src_owner].push_back(CopyComTag(b, b+(*pit), k_dst, k_src));
                            if (check_remote) {
                                bl_remote.push_back(b);
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }

        for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
        {
            CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
            for (auto& kv : Tags)
            {
                std::vector<CopyComTag>& cctv = kv.second;
                // We need to fix the order so that the send and recv processes match.
                std::sort(cctv.begin(), cctv.end());
            }
        }
    }
}